

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PimplCyclic.cpp
# Opt level: O1

void __thiscall PimplCyclic::Cyclic::Impl::doSomething(Impl *this)

{
  __shared_ptr<PimplCyclic::Cyclic::Impl,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  std::__shared_ptr<PimplCyclic::Cyclic::Impl,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<PimplCyclic::Cyclic::Impl,void>
            (local_20,(__weak_ptr<PimplCyclic::Cyclic::Impl,_(__gnu_cxx::_Lock_policy)2> *)this);
  std::function<void()>::operator=
            ((function<void()> *)&this->_fn,(anon_class_16_1_8991873d *)local_20);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"N11PimplCyclic6Cyclic4ImplE",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"::",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"doSomething",0xb);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  return;
}

Assistant:

void doSomething()
    {
        _fn = [shis = shared_from_this()](){};

        std::cout << typeid(*this).name() << "::" << __func__ << std::endl;
    }